

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::TParseContext::addOutputArgumentConversions
          (TParseContext *this,TFunction *function,TIntermAggregate *intermNode)

{
  TIntermediate *pTVar1;
  TArraySizes *pTVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar8;
  TType *pTVar9;
  undefined4 extraout_var_01;
  long lVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermSymbol *pTVar11;
  undefined4 extraout_var_04;
  TIntermAggregate *node;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TType *pTVar12;
  undefined8 *puVar13;
  TPoolAllocator *this_00;
  TVariable *variable;
  undefined4 extraout_var_08;
  TQualifier *this_01;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TIntermSymbol *pTVar14;
  TSourceLoc *pTVar15;
  TIntermTyped *pTVar16;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  ulong uVar17;
  TType paramType;
  TIntermAggregate *local_f8;
  TVariable *local_e8;
  TType local_c8;
  long lVar7;
  
  iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
            _vptr_TIntermNode[0x32])(intermNode);
  lVar7 = CONCAT44(extraout_var,iVar5);
  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar5) {
    uVar17 = 0;
    do {
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar17 & 0xffffffff);
      pTVar12 = *(TType **)(CONCAT44(extraout_var_00,iVar5) + 8);
      plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) + 0x18))();
      pTVar9 = (TType *)(**(code **)(*plVar8 + 0xf0))(plVar8);
      bVar3 = TType::operator==(pTVar12,pTVar9);
      if (!bVar3) {
        iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar17 & 0xffffffff);
        lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar5) + 8) + 0x50))();
        if ((*(uint *)(lVar10 + 8) & 0x7f) - 0x11 < 2) {
          iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x20])();
          if (iVar5 == 0) {
            local_e8 = (TVariable *)0x0;
            node = intermNode;
          }
          else {
            iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                      _vptr_TIntermNode[0x1e])(intermNode);
            local_e8 = makeInternalVariable
                                 (this,"tempReturn",(TType *)CONCAT44(extraout_var_02,iVar5));
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode)(intermNode);
            pTVar11 = TIntermediate::addSymbol
                                (pTVar1,local_e8,(TSourceLoc *)CONCAT44(extraout_var_03,iVar5));
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode)(intermNode);
            node = (TIntermAggregate *)
                   TIntermediate::addAssign
                             (pTVar1,EOpAssign,&pTVar11->super_TIntermTyped,
                              (TIntermTyped *)intermNode,
                              (TSourceLoc *)CONCAT44(extraout_var_04,iVar5));
          }
          local_f8 = TIntermediate::makeAggregate
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                                (TIntermNode *)node);
          iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
          if (0 < iVar5) {
            uVar17 = 0;
            do {
              iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function,uVar17 & 0xffffffff)
              ;
              pTVar12 = *(TType **)(CONCAT44(extraout_var_05,iVar5) + 8);
              plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) + 0x18))
                                         ();
              pTVar9 = (TType *)(**(code **)(*plVar8 + 0xf0))(plVar8);
              bVar3 = TType::operator==(pTVar12,pTVar9);
              if (!bVar3) {
                iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])(function);
                lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_06,iVar5) + 8) + 0x50))();
                if ((*(uint *)(lVar10 + 8) & 0x7f) - 0x11 < 2) {
                  TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
                  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])
                                    (function,uVar17 & 0xffffffff);
                  TType::shallowCopy(&local_c8,*(TType **)(CONCAT44(extraout_var_07,iVar5) + 8));
                  plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) +
                                               0x18))();
                  plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
                  cVar4 = (**(code **)(*plVar8 + 0x188))(plVar8);
                  if ((cVar4 != '\0') && (local_c8.typeParameters == (TTypeParameters *)0x0)) {
                    plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) +
                                                 0x18))();
                    pTVar12 = (TType *)(**(code **)(*plVar8 + 0xf0))(plVar8);
                    TType::shallowCopy(&local_c8,pTVar12);
                    plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) +
                                                 0x18))();
                    plVar8 = (long *)(**(code **)(*plVar8 + 0xf0))(plVar8);
                    puVar13 = (undefined8 *)(**(code **)(*plVar8 + 0xb0))(plVar8);
                    this_00 = GetThreadPoolAllocator();
                    local_c8.typeParameters =
                         (TTypeParameters *)TPoolAllocator::allocate(this_00,0x18);
                    (local_c8.typeParameters)->basicType = EbtVoid;
                    (local_c8.typeParameters)->arraySizes = (TArraySizes *)0x0;
                    (local_c8.typeParameters)->spirvType = (TSpirvType *)0x0;
                    (local_c8.typeParameters)->spirvType = (TSpirvType *)puVar13[2];
                    pTVar2 = (TArraySizes *)puVar13[1];
                    *(undefined8 *)local_c8.typeParameters = *puVar13;
                    (local_c8.typeParameters)->arraySizes = pTVar2;
                  }
                  variable = makeInternalVariable(this,"tempArg",&local_c8);
                  iVar5 = (*(variable->super_TSymbol)._vptr_TSymbol[0xd])(variable);
                  this_01 = (TQualifier *)
                            (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar5) + 0x50))
                                      ((long *)CONCAT44(extraout_var_08,iVar5));
                  this_01->semanticName = (char *)0x0;
                  *(ulong *)&this_01->field_0x8 = *(ulong *)&this_01->field_0x8 & 0xf80000141fff0000
                  ;
                  TQualifier::clearLayout(this_01);
                  this_01->spirvStorageClass = -1;
                  this_01->spirvDecorate = (TSpirvDecorate *)0x0;
                  this_01->field_0xf = this_01->field_0xf & 0xe7;
                  iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x28])
                                    (function,uVar17 & 0xffffffff);
                  lVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar5) + 8) + 0x50))();
                  if (((*(uint *)(lVar10 + 8) & 0x7f) < 0x14) &&
                     ((0xd0000U >> (*(uint *)(lVar10 + 8) & 0x1f) & 1) != 0)) {
                    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                    iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.
                               super_TIntermNode._vptr_TIntermNode)(intermNode);
                    pTVar11 = TIntermediate::addSymbol
                                        (pTVar1,variable,
                                         (TSourceLoc *)CONCAT44(extraout_var_10,iVar5));
                    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                    plVar8 = (long *)(**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) +
                                                 0x18))();
                    pTVar14 = (TIntermSymbol *)(**(code **)(*plVar8 + 0x60))(plVar8);
                    pTVar14 = TIntermediate::addSymbol(pTVar1,pTVar14);
                    pTVar15 = (TSourceLoc *)
                              (**(code **)**(undefined8 **)(*(long *)(lVar7 + 8) + uVar17 * 8))();
                    pTVar16 = TIntermediate::addAssign
                                        (pTVar1,EOpAssign,&pTVar11->super_TIntermTyped,
                                         &pTVar14->super_TIntermTyped,pTVar15);
                    pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                    iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.
                               super_TIntermNode._vptr_TIntermNode)(intermNode);
                    local_f8 = TIntermediate::mergeAggregate
                                         (pTVar1,&pTVar16->super_TIntermNode,(TIntermNode *)local_f8
                                          ,(TSourceLoc *)CONCAT44(extraout_var_11,iVar5));
                  }
                  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.
                             super_TIntermNode._vptr_TIntermNode)(intermNode);
                  pTVar11 = TIntermediate::addSymbol
                                      (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_12,iVar5)
                                      );
                  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar16 = (TIntermTyped *)
                            (**(code **)(**(long **)(*(long *)(lVar7 + 8) + uVar17 * 8) + 0x18))();
                  pTVar15 = (TSourceLoc *)
                            (**(code **)**(undefined8 **)(*(long *)(lVar7 + 8) + uVar17 * 8))();
                  pTVar16 = TIntermediate::addAssign
                                      (pTVar1,EOpAssign,pTVar16,&pTVar11->super_TIntermTyped,pTVar15
                                      );
                  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  pTVar15 = (TSourceLoc *)
                            (**(code **)**(undefined8 **)(*(long *)(lVar7 + 8) + uVar17 * 8))();
                  local_f8 = TIntermediate::growAggregate
                                       (pTVar1,(TIntermNode *)local_f8,&pTVar16->super_TIntermNode,
                                        pTVar15);
                  pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
                  iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.
                             super_TIntermNode._vptr_TIntermNode)(intermNode);
                  pTVar11 = TIntermediate::addSymbol
                                      (pTVar1,variable,(TSourceLoc *)CONCAT44(extraout_var_13,iVar5)
                                      );
                  *(TIntermSymbol **)(*(long *)(lVar7 + 8) + uVar17 * 8) = pTVar11;
                }
              }
              uVar17 = uVar17 + 1;
              iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
            } while ((long)uVar17 < (long)iVar5);
          }
          if (local_e8 != (TVariable *)0x0) {
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode)(intermNode);
            pTVar11 = TIntermediate::addSymbol
                                (pTVar1,local_e8,(TSourceLoc *)CONCAT44(extraout_var_14,iVar5));
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar5 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                       _vptr_TIntermNode)(intermNode);
            local_f8 = TIntermediate::growAggregate
                                 (pTVar1,(TIntermNode *)local_f8,(TIntermNode *)pTVar11,
                                  (TSourceLoc *)CONCAT44(extraout_var_15,iVar5));
          }
          pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          iVar5 = (*(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x1e])(intermNode);
          iVar6 = (**(intermNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                     _vptr_TIntermNode)(intermNode);
          pTVar16 = TIntermediate::setAggregateOperator
                              (pTVar1,(TIntermNode *)local_f8,EOpComma,
                               (TType *)CONCAT44(extraout_var_16,iVar5),
                               (TSourceLoc *)CONCAT44(extraout_var_17,iVar6));
          return pTVar16;
        }
      }
      uVar17 = uVar17 + 1;
      iVar5 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((long)uVar17 < (long)iVar5);
  }
  return (TIntermTyped *)intermNode;
}

Assistant:

TIntermTyped* TParseContext::addOutputArgumentConversions(const TFunction& function, TIntermAggregate& intermNode) const
{
    TIntermSequence& arguments = intermNode.getSequence();

    // Will there be any output conversions?
    bool outputConversions = false;
    for (int i = 0; i < function.getParamCount(); ++i) {
        if (*function[i].type != arguments[i]->getAsTyped()->getType() && function[i].type->getQualifier().isParamOutput()) {
            outputConversions = true;
            break;
        }
    }

    if (! outputConversions)
        return &intermNode;

    // Setup for the new tree, if needed:
    //
    // Output conversions need a different tree topology.
    // Out-qualified arguments need a temporary of the correct type, with the call
    // followed by an assignment of the temporary to the original argument:
    //     void: function(arg, ...)  ->        (          function(tempArg, ...), arg = tempArg, ...)
    //     ret = function(arg, ...)  ->  ret = (tempRet = function(tempArg, ...), arg = tempArg, ..., tempRet)
    // Where the "tempArg" type needs no conversion as an argument, but will convert on assignment.
    TIntermTyped* conversionTree = nullptr;
    TVariable* tempRet = nullptr;
    if (intermNode.getBasicType() != EbtVoid) {
        // do the "tempRet = function(...), " bit from above
        tempRet = makeInternalVariable("tempReturn", intermNode.getType());
        TIntermSymbol* tempRetNode = intermediate.addSymbol(*tempRet, intermNode.getLoc());
        conversionTree = intermediate.addAssign(EOpAssign, tempRetNode, &intermNode, intermNode.getLoc());
    } else
        conversionTree = &intermNode;

    conversionTree = intermediate.makeAggregate(conversionTree);

    // Process each argument's conversion
    for (int i = 0; i < function.getParamCount(); ++i) {
        if (*function[i].type != arguments[i]->getAsTyped()->getType()) {
            if (function[i].type->getQualifier().isParamOutput()) {
                // Out-qualified arguments need to use the topology set up above.
                // do the " ...(tempArg, ...), arg = tempArg" bit from above
                TType paramType;
                paramType.shallowCopy(*function[i].type);
                if (arguments[i]->getAsTyped()->getType().isParameterized() &&
                    !paramType.isParameterized()) {
                    paramType.shallowCopy(arguments[i]->getAsTyped()->getType());
                    paramType.copyTypeParameters(*arguments[i]->getAsTyped()->getType().getTypeParameters());
                }
                TVariable* tempArg = makeInternalVariable("tempArg", paramType);
                tempArg->getWritableType().getQualifier().makeTemporary();
                if (function[i].type->getQualifier().isParamInput()) {
                    // If the parameter is also an input, copy-in.
                    TIntermSymbol* tempArgNode = intermediate.addSymbol(*tempArg, intermNode.getLoc());
                    TIntermTyped* tempAssign = intermediate.addAssign(EOpAssign, tempArgNode, intermediate.addSymbol(*arguments[i]->getAsTyped()->getAsSymbolNode()), arguments[i]->getLoc());
                    conversionTree = intermediate.mergeAggregate(tempAssign, conversionTree, intermNode.getLoc());
                }

                TIntermSymbol* tempArgNode = intermediate.addSymbol(*tempArg, intermNode.getLoc());
                TIntermTyped* tempAssign = intermediate.addAssign(EOpAssign, arguments[i]->getAsTyped(), tempArgNode, arguments[i]->getLoc());
                conversionTree = intermediate.growAggregate(conversionTree, tempAssign, arguments[i]->getLoc());
                // replace the argument with another node for the same tempArg variable
                arguments[i] = intermediate.addSymbol(*tempArg, intermNode.getLoc());
            }
        }
    }

    // Finalize the tree topology (see bigger comment above).
    if (tempRet) {
        // do the "..., tempRet" bit from above
        TIntermSymbol* tempRetNode = intermediate.addSymbol(*tempRet, intermNode.getLoc());
        conversionTree = intermediate.growAggregate(conversionTree, tempRetNode, intermNode.getLoc());
    }
    conversionTree = intermediate.setAggregateOperator(conversionTree, EOpComma, intermNode.getType(), intermNode.getLoc());

    return conversionTree;
}